

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryCompressedTTF
          (ImFontAtlas *this,void *compressed_ttf_data,int compressed_ttf_size,float size_pixels,
          ImFontConfig *font_cfg_template,ImWchar *glyph_ranges)

{
  int iVar1;
  float fVar2;
  int iVar3;
  float fVar4;
  byte bVar5;
  uint uVar6;
  undefined8 uVar7;
  uchar *puVar8;
  ImFont *pIVar9;
  uchar *puVar10;
  ushort *puVar11;
  ushort extraout_DX;
  ushort extraout_DX_00;
  ushort extraout_DX_01;
  ushort extraout_DX_02;
  ushort extraout_DX_03;
  ushort extraout_DX_04;
  ushort extraout_DX_05;
  uint uVar12;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ushort *puVar13;
  ulong uVar14;
  undefined8 in_R9;
  uint uVar15;
  undefined2 local_124;
  undefined1 local_122;
  undefined2 local_120;
  undefined1 local_11e;
  undefined3 local_118;
  undefined5 uStack_115;
  undefined3 uStack_110;
  float fStack_10d;
  float fStack_109;
  char local_e8 [48];
  ImFontConfig local_b8;
  
  uVar6 = *(uint *)((long)compressed_ttf_data + 8);
  uVar15 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  puVar8 = (uchar *)ImGui::MemAlloc((ulong)uVar15);
  local_b8._52_4_ = SUB84(in_R9,0);
  uVar6 = *compressed_ttf_data;
  local_b8._126_2_ = extraout_DX;
  if (((uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18) ==
       0x57bc0000) &&
     (uVar6 = *(uint *)((long)compressed_ttf_data + 4),
     ((uVar6 >> 0x18 == 0 && (uVar6 & 0xff0000) == 0) && (uVar6 & 0xff00) == 0) &&
     (uVar6 & 0xff) == 0)) {
    uVar6 = *(uint *)((long)compressed_ttf_data + 8);
    puVar13 = (ushort *)((long)compressed_ttf_data + 0x10);
    stb__barrier_in_b = (uchar *)compressed_ttf_data;
    stb__barrier_out_e =
         puVar8 + (uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18);
    stb__barrier_out_b = puVar8;
    stb__dout = puVar8;
    do {
      bVar5 = (byte)*puVar13;
      local_b8._126_2_ = ZEXT12(bVar5);
      uVar12 = (uint)bVar5;
      if (bVar5 < 0x20) {
        if (bVar5 < 0x18) {
          if (bVar5 < 0x10) {
            if (bVar5 < 8) {
              if (bVar5 == 4) {
                stb__match(stb__dout +
                           ~((ulong)*(byte *)((long)puVar13 + 3) |
                             (ulong)*(byte *)((long)puVar13 + 1) << 0x10 |
                            (ulong)(byte)puVar13[1] << 8),
                           (ushort)(puVar13[2] << 8 | puVar13[2] >> 8) + 1);
                puVar11 = puVar13 + 3;
                local_b8._126_2_ = extraout_DX_04;
              }
              else {
                if (uVar12 == 6) {
                  uVar14 = ~((ulong)*(byte *)((long)puVar13 + 3) |
                             (ulong)*(byte *)((long)puVar13 + 1) << 0x10 |
                            (ulong)(byte)puVar13[1] << 8);
                  uVar12 = (uint)(byte)puVar13[2];
                  goto LAB_00177f11;
                }
                puVar11 = puVar13;
                if (uVar12 == 7) {
                  local_b8._126_2_ =
                       *(ushort *)((long)puVar13 + 1) << 8 | *(ushort *)((long)puVar13 + 1) >> 8;
                  puVar10 = stb__dout + (ulong)(ushort)local_b8._126_2_ + 1;
                  if (puVar10 <= stb__barrier_out_e) {
                    if ((byte *)((long)puVar13 + 3) < stb__barrier_in_b) {
                      puVar10 = stb__barrier_out_e + 1;
                    }
                    else {
                      memcpy(stb__dout,(byte *)((long)puVar13 + 3),
                             (ulong)(ushort)local_b8._126_2_ + 1);
                      local_b8._126_2_ = extraout_DX_05;
                    }
                  }
                  puVar11 = (ushort *)
                            ((long)puVar13 +
                            (ulong)(ushort)(*(ushort *)((long)puVar13 + 1) << 8 |
                                           *(ushort *)((long)puVar13 + 1) >> 8) + 4);
                  stb__dout = puVar10;
                }
              }
            }
            else {
              uVar14 = (ulong)(((uint)bVar5 * 0x100 + (uint)*(byte *)((long)puVar13 + 1)) - 0x7ff);
              puVar10 = stb__dout + uVar14;
              if (puVar10 <= stb__barrier_out_e) {
                if (puVar13 + 1 < stb__barrier_in_b) {
                  puVar10 = stb__barrier_out_e + 1;
                }
                else {
                  memcpy(stb__dout,puVar13 + 1,uVar14);
                  uVar14 = extraout_RDX_00;
                }
              }
              local_b8._126_2_ = SUB82(uVar14,0);
              puVar11 = (ushort *)
                        ((long)puVar13 + ((ulong)(ushort)(*puVar13 << 8 | *puVar13 >> 8) - 0x7fd));
              stb__dout = puVar10;
            }
          }
          else {
            uVar14 = -(ulong)(((uint)*(byte *)((long)puVar13 + 1) * 0x100 +
                              ((uint)(byte)puVar13[1] | (uint)bVar5 << 0x10)) - 0xfffff);
            uVar12 = (uint)(ushort)(*(ushort *)((long)puVar13 + 3) << 8 |
                                   *(ushort *)((long)puVar13 + 3) >> 8);
LAB_00177f11:
            stb__match(stb__dout + uVar14,uVar12 + 1);
            puVar11 = (ushort *)((long)puVar13 + 5);
            local_b8._126_2_ = extraout_DX_02;
          }
        }
        else {
          stb__match(stb__dout +
                     -(ulong)(((uint)*(byte *)((long)puVar13 + 1) * 0x100 +
                              ((uint)(byte)puVar13[1] | (uint)bVar5 << 0x10)) - 0x17ffff),
                     *(byte *)((long)puVar13 + 3) + 1);
          puVar11 = puVar13 + 2;
          local_b8._126_2_ = extraout_DX_01;
        }
      }
      else if ((char)bVar5 < '\0') {
        stb__match(stb__dout + ~(ulong)*(byte *)((long)puVar13 + 1),uVar12 - 0x7f);
        puVar11 = puVar13 + 1;
        local_b8._126_2_ = extraout_DX_03;
      }
      else if (bVar5 < 0x40) {
        uVar14 = (ulong)(uVar12 - 0x1f);
        puVar10 = stb__dout + uVar14;
        if (puVar10 <= stb__barrier_out_e) {
          if ((byte *)((long)puVar13 + 1) < stb__barrier_in_b) {
            puVar10 = stb__barrier_out_e + 1;
          }
          else {
            memcpy(stb__dout,(byte *)((long)puVar13 + 1),uVar14);
            uVar14 = extraout_RDX;
          }
        }
        local_b8._126_2_ = SUB82(uVar14,0);
        puVar11 = (ushort *)((long)puVar13 + ((ulong)(byte)*puVar13 - 0x1e));
        stb__dout = puVar10;
      }
      else {
        stb__match(stb__dout +
                   -(ulong)(((uint)*(byte *)((long)puVar13 + 1) + (uint)bVar5 * 0x100) - 0x3fff),
                   (byte)puVar13[1] + 1);
        puVar11 = (ushort *)((long)puVar13 + 3);
        local_b8._126_2_ = extraout_DX_00;
      }
      local_b8._52_4_ = SUB84(in_R9,0);
    } while ((puVar11 != puVar13) &&
            (puVar13 = puVar11,
            stb__dout <=
            puVar8 + (uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                     uVar6 << 0x18)));
  }
  if (font_cfg_template == (ImFontConfig *)0x0) {
    uStack_115 = 0;
    uStack_110 = 0;
    fStack_10d = 0.0;
    fStack_109 = 0.0;
    local_e8[0] = '\0';
    local_e8[1] = '\0';
    local_e8[2] = '\0';
    local_e8[3] = '\0';
    local_e8[4] = '\0';
    local_e8[5] = '\0';
    local_e8[6] = '\0';
    local_e8[7] = '\0';
    local_e8[8] = '\0';
    local_e8[9] = '\0';
    local_e8[10] = '\0';
    local_e8[0xb] = '\0';
    local_e8[0xc] = '\0';
    local_e8[0xd] = '\0';
    local_e8[0xe] = '\0';
    local_e8[0xf] = '\0';
    local_e8[0x10] = '\0';
    local_e8[0x11] = '\0';
    local_e8[0x12] = '\0';
    local_e8[0x13] = '\0';
    local_e8[0x14] = '\0';
    local_e8[0x15] = '\0';
    local_e8[0x16] = '\0';
    local_e8[0x17] = '\0';
    local_e8[0x18] = '\0';
    local_e8[0x19] = '\0';
    local_e8[0x1a] = '\0';
    local_e8[0x1b] = '\0';
    local_e8[0x1c] = '\0';
    local_e8[0x1d] = '\0';
    local_e8[0x1e] = '\0';
    local_e8[0x1f] = '\0';
    local_e8[0x20] = '\0';
    local_e8[0x21] = '\0';
    local_e8[0x22] = '\0';
    local_e8[0x23] = '\0';
    local_e8[0x24] = '\0';
    local_e8[0x25] = '\0';
    local_e8[0x26] = '\0';
    local_e8[0x27] = '\0';
    iVar1 = 3;
    iVar3 = 1;
    fVar2 = 0.0;
    fVar4 = 3.4028235e+38;
    local_b8.DstFont = (ImFont *)0x0;
    local_b8.RasterizerMultiply = 1.0;
    local_b8.EllipsisChar = 0xffff;
    local_b8.RasterizerFlags = 0;
    local_b8.MergeMode = false;
    local_b8.GlyphRanges = (ImWchar *)0x0;
    local_b8.PixelSnapH = false;
    local_b8.FontNo = 0;
  }
  else {
    local_11e = font_cfg_template->field_0xf;
    local_120 = *(undefined2 *)&font_cfg_template->field_0xd;
    local_b8.FontNo = font_cfg_template->FontNo;
    iVar1 = font_cfg_template->OversampleH;
    iVar3 = font_cfg_template->OversampleV;
    local_b8.PixelSnapH = font_cfg_template->PixelSnapH;
    uVar7 = *(undefined8 *)((long)&(font_cfg_template->GlyphExtraSpacing).y + 1);
    local_118 = (undefined3)*(undefined8 *)&font_cfg_template->field_0x21;
    uStack_115 = (undefined5)((ulong)*(undefined8 *)&font_cfg_template->field_0x21 >> 0x18);
    uStack_110 = (undefined3)uVar7;
    fStack_10d = (float)((ulong)uVar7 >> 0x18);
    fStack_109._1_3_ = (undefined3)((uint)(font_cfg_template->GlyphOffset).y >> 8);
    fStack_109._0_1_ = (undefined1)((ulong)uVar7 >> 0x38);
    local_b8._52_4_ = *(undefined4 *)&font_cfg_template->field_0x34;
    local_b8.GlyphRanges = font_cfg_template->GlyphRanges;
    fVar2 = font_cfg_template->GlyphMinAdvanceX;
    fVar4 = font_cfg_template->GlyphMaxAdvanceX;
    local_b8.MergeMode = font_cfg_template->MergeMode;
    local_122 = font_cfg_template->field_0x4b;
    local_124 = *(undefined2 *)&font_cfg_template->field_0x49;
    local_b8.RasterizerFlags = font_cfg_template->RasterizerFlags;
    local_b8.RasterizerMultiply = font_cfg_template->RasterizerMultiply;
    local_b8.EllipsisChar = font_cfg_template->EllipsisChar;
    local_e8._32_8_ = *(undefined8 *)(font_cfg_template->Name + 0x20);
    local_e8._16_8_ = *(undefined8 *)(font_cfg_template->Name + 0x10);
    local_e8._24_8_ = *(undefined8 *)(font_cfg_template->Name + 0x18);
    local_e8._0_8_ = *(undefined8 *)font_cfg_template->Name;
    local_e8._8_8_ = *(undefined8 *)(font_cfg_template->Name + 8);
    local_b8._126_2_ = *(undefined2 *)&font_cfg_template->field_0x7e;
    local_b8.DstFont = font_cfg_template->DstFont;
  }
  local_b8.FontDataOwnedByAtlas = true;
  local_b8._13_2_ = local_120;
  local_b8._15_1_ = local_11e;
  local_b8.OversampleV = iVar3;
  local_b8.OversampleH = iVar1;
  local_b8.GlyphExtraSpacing._0_5_ = uStack_115;
  local_b8._33_3_ = local_118;
  local_b8.GlyphOffset.x = fStack_10d;
  local_b8.GlyphExtraSpacing.y._1_3_ = uStack_110;
  local_b8.GlyphOffset.y = fStack_109;
  local_b8.GlyphMaxAdvanceX = fVar4;
  local_b8.GlyphMinAdvanceX = fVar2;
  local_b8._75_1_ = local_122;
  local_b8._73_2_ = local_124;
  local_b8.Name[0] = local_e8[0];
  local_b8.Name[1] = local_e8[1];
  local_b8.Name[2] = local_e8[2];
  local_b8.Name[3] = local_e8[3];
  local_b8.Name[4] = local_e8[4];
  local_b8.Name[5] = local_e8[5];
  local_b8.Name[6] = local_e8[6];
  local_b8.Name[7] = local_e8[7];
  local_b8.Name[8] = local_e8[8];
  local_b8.Name[9] = local_e8[9];
  local_b8.Name[10] = local_e8[10];
  local_b8.Name[0xb] = local_e8[0xb];
  local_b8.Name[0xc] = local_e8[0xc];
  local_b8.Name[0xd] = local_e8[0xd];
  local_b8.Name[0xe] = local_e8[0xe];
  local_b8.Name[0xf] = local_e8[0xf];
  local_b8.Name[0x10] = local_e8[0x10];
  local_b8.Name[0x11] = local_e8[0x11];
  local_b8.Name[0x12] = local_e8[0x12];
  local_b8.Name[0x13] = local_e8[0x13];
  local_b8.Name[0x14] = local_e8[0x14];
  local_b8.Name[0x15] = local_e8[0x15];
  local_b8.Name[0x16] = local_e8[0x16];
  local_b8.Name[0x17] = local_e8[0x17];
  local_b8.Name[0x18] = local_e8[0x18];
  local_b8.Name[0x19] = local_e8[0x19];
  local_b8.Name[0x1a] = local_e8[0x1a];
  local_b8.Name[0x1b] = local_e8[0x1b];
  local_b8.Name[0x1c] = local_e8[0x1c];
  local_b8.Name[0x1d] = local_e8[0x1d];
  local_b8.Name[0x1e] = local_e8[0x1e];
  local_b8.Name[0x1f] = local_e8[0x1f];
  local_b8.Name[0x20] = local_e8[0x20];
  local_b8.Name[0x21] = local_e8[0x21];
  local_b8.Name[0x22] = local_e8[0x22];
  local_b8.Name[0x23] = local_e8[0x23];
  local_b8.Name[0x24] = local_e8[0x24];
  local_b8.Name[0x25] = local_e8[0x25];
  local_b8.Name[0x26] = local_e8[0x26];
  local_b8.Name[0x27] = local_e8[0x27];
  if (glyph_ranges != (ImWchar *)0x0) {
    local_b8.GlyphRanges = glyph_ranges;
  }
  local_b8.FontData = puVar8;
  local_b8.FontDataSize = uVar15;
  local_b8.SizePixels = size_pixels;
  pIVar9 = AddFont(this,&local_b8);
  return pIVar9;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryCompressedTTF(const void* compressed_ttf_data, int compressed_ttf_size, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    const unsigned int buf_decompressed_size = stb_decompress_length((const unsigned char*)compressed_ttf_data);
    unsigned char* buf_decompressed_data = (unsigned char *)IM_ALLOC(buf_decompressed_size);
    stb_decompress(buf_decompressed_data, (const unsigned char*)compressed_ttf_data, (unsigned int)compressed_ttf_size);

    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    IM_ASSERT(font_cfg.FontData == NULL);
    font_cfg.FontDataOwnedByAtlas = true;
    return AddFontFromMemoryTTF(buf_decompressed_data, (int)buf_decompressed_size, size_pixels, &font_cfg, glyph_ranges);
}